

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O0

void d68000_dbra(m68k_info *info)

{
  uint value;
  m68k_info *in_RDI;
  int unaff_retaddr;
  int in_stack_00000008;
  int in_stack_0000000c;
  
  value = read_imm_16(in_RDI);
  make_int_16(value);
  build_dbxx(info,in_stack_0000000c,in_stack_00000008,unaff_retaddr);
  return;
}

Assistant:

static void d68000_dbra(m68k_info *info)
{
	build_dbxx(info, M68K_INS_DBRA, 0, make_int_16(read_imm_16(info)));
}